

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

iter_result_opt * __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::lte_key_byte(iter_result_opt *__return_storage_ptr__,
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              *this,node_type type,byte key_byte)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  kVar4;
  byte bVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  undefined4 local_e;
  undefined2 local_a;
  
  switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
  case 0:
    __assert_fail("type != node_type::LEAF",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x428,
                  "iter_result_opt unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::lte_key_byte(node_type, std::byte) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  case 1:
    uVar3 = (ulong)(this->children_count).value.super___atomic_base<unsigned_char>._M_i;
    do {
      if ((long)uVar3 < 1) goto LAB_00141138;
      uVar3 = uVar3 - 1;
      bVar5 = (&this->field_0x24)[uVar3 & 0xff];
    } while (key_byte < bVar5);
    kVar4 = this->k_prefix;
    uVar6 = (ulong)this | 1;
    break;
  case 2:
    uVar3 = (ulong)(this->children_count).value.super___atomic_base<unsigned_char>._M_i;
    do {
      if ((long)uVar3 < 1) goto LAB_00141138;
      uVar3 = uVar3 - 1;
      bVar5 = *(byte *)((long)&this[1].super_header_type.m_lock.read_lock_count.
                               super___atomic_base<long>._M_i + (uVar3 & 0xff));
    } while (key_byte < bVar5);
    kVar4 = this->k_prefix;
    uVar6 = (ulong)this | 2;
    break;
  case 3:
    uVar3 = (ulong)key_byte;
    do {
      if ((&this->field_0x21)[uVar3 & 0xff] != -1) {
        kVar4 = this->k_prefix;
        uVar6 = (ulong)this | 3;
LAB_00141154:
        (__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_payload._M_value.node.tagged_ptr = uVar6;
        bVar2 = (byte)uVar3;
        (__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_payload._M_value.key_byte = bVar2;
        goto LAB_0014115a;
      }
      bVar1 = 0 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
    goto LAB_00141138;
  case 4:
    uVar3 = (ulong)key_byte;
    do {
      if ((&this[1].super_header_type.m_lock.version)[uVar3 & 0xff].version.
          super___atomic_base<unsigned_long>._M_i != 0) {
        kVar4 = this->k_prefix;
        uVar6 = (ulong)this | 4;
        goto LAB_00141154;
      }
      bVar1 = 0 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
LAB_00141138:
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.node.tagged_ptr = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
             ._M_payload + 8) = 0;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.prefix.u64 = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _M_engaged = 0;
    return __return_storage_ptr__;
  default:
    basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
    ::lte_key_byte();
  }
  bVar2 = (byte)uVar3;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.node.tagged_ptr = uVar6;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.key_byte = bVar5;
LAB_0014115a:
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.child_index = bVar2;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
           ._M_payload + 10) = local_e;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
           ._M_payload + 0xe) = local_a;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.prefix = (key_prefix_snapshot)kVar4;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr iter_result_opt lte_key_byte(
      node_type type, std::byte key_byte) noexcept {
    UNODB_DETAIL_ASSERT(type != node_type::LEAF);
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->lte_key_byte(key_byte);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->lte_key_byte(key_byte);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->lte_key_byte(key_byte);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->lte_key_byte(key_byte);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }